

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindow::~QMdiSubWindow(QMdiSubWindow *this)

{
  QMdiSubWindowPrivate *this_00;
  Data *pDVar1;
  QObject *pQVar2;
  
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_00804510;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QMdiSubWindow_008046c0;
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  QMdiSubWindowPrivate::removeButtonsFromMenuBar(this_00);
  pQVar2 = (QObject *)0x0;
  QMdiSubWindowPrivate::setActive(this_00,false,true);
  pDVar1 = (this_00->controlContainer).wp.d;
  if (pDVar1 != (Data *)0x0) {
    if (*(int *)(pDVar1 + 4) == 0) {
      pQVar2 = (QObject *)0x0;
    }
    else {
      pQVar2 = (this_00->controlContainer).wp.value;
    }
  }
  if (pQVar2 != (QObject *)0x0) {
    (**(code **)(*(long *)pQVar2 + 0x20))(pQVar2);
  }
  QWidget::~QWidget(&this->super_QWidget);
  return;
}

Assistant:

QMdiSubWindow::~QMdiSubWindow()
{
    Q_D(QMdiSubWindow);
#if QT_CONFIG(menubar)
    d->removeButtonsFromMenuBar();
#endif
    d->setActive(false);
    delete d->controlContainer;
}